

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void dlib::
     isort_array<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *array,unsigned_long left,unsigned_long right,case_insensitive_compare *comp)

{
  pointer pbVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (left + 1 <= right) {
    lVar6 = left << 5;
    lVar8 = -1;
    uVar2 = left + 1;
    do {
      uVar4 = uVar2;
      pbVar1 = (array->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar3 = open_file_box_helper::case_insensitive_compare::operator()
                        (comp,pbVar1 + uVar4,pbVar1 + left);
      lVar5 = lVar8;
      lVar7 = lVar6;
      while (bVar3 != false) {
        std::__cxx11::string::swap
                  ((string *)
                   ((long)&(array->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + lVar7));
        lVar5 = lVar5 + 1;
        if (lVar5 == 0) break;
        pbVar1 = (array->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar3 = open_file_box_helper::case_insensitive_compare::operator()
                          (comp,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7),
                           (string *)((long)&pbVar1[-1]._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + -0x20;
      }
      lVar6 = lVar6 + 0x20;
      lVar8 = lVar8 + -1;
      uVar2 = uVar4 + 1;
      left = uVar4;
    } while (uVar4 + 1 <= right);
  }
  return;
}

Assistant:

void isort_array (
        T& array,
        const unsigned long left,
        const unsigned long right,
        const compare& comp
    )
    {
        DLIB_ASSERT (left <= right,
                "\tvoid isort_array()"
                << "\n\tleft:          " << left
                << "\n\tright:         " << right );
        using namespace sort_helpers;

        unsigned long pos;
        for (unsigned long i = left+1; i <= right; ++i)
        {
            // everything from left to i-1 is sorted.
            pos = i;
            for (unsigned long j = i-1; comp(array[pos] , array[j]); --j)
            {
                exchange(array[pos],array[j]);
                pos = j;
                
                if (j == left)
                    break;
            }
        }
    }